

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascOpenFile.cpp
# Opt level: O0

bool CascOpenFile(HANDLE hStorage,char *szFileName,DWORD dwLocaleFlags,DWORD dwOpenFlags,
                 HANDLE *phFile)

{
  int iVar1;
  uint uVar2;
  DWORD DVar3;
  undefined4 extraout_var;
  DWORD local_74;
  bool local_6d;
  int nError;
  BYTE local_68 [3];
  bool bOpenResult;
  DWORD dwContentSize;
  BYTE KeyBuffer [16];
  BYTE *local_50;
  LPBYTE pbQueryKey;
  QUERY_KEY QueryKey;
  TCascStorage *hs;
  HANDLE *phFile_local;
  DWORD dwOpenFlags_local;
  DWORD dwLocaleFlags_local;
  char *szFileName_local;
  HANDLE hStorage_local;
  
  local_50 = (BYTE *)0x0;
  nError = -1;
  local_6d = false;
  local_74 = 0;
  QueryKey.cbData = (size_t)IsValidCascStorageHandle(hStorage);
  if ((TCascStorage *)QueryKey.cbData == (TCascStorage *)0x0) {
    SetLastError(9);
    hStorage_local._7_1_ = false;
  }
  else if (((szFileName == (char *)0x0) || (*szFileName == '\0')) || (phFile == (HANDLE *)0x0)) {
    SetLastError(0x16);
    hStorage_local._7_1_ = false;
  }
  else {
    phFile_local._0_4_ = dwOpenFlags;
    if ((dwOpenFlags & 0xf) == 0) {
      iVar1 = (*((TCascStorage *)QueryKey.cbData)->pRootHandler->_vptr_TRootHandler[5])
                        (((TCascStorage *)QueryKey.cbData)->pRootHandler,szFileName,&nError);
      local_50 = (BYTE *)CONCAT44(extraout_var,iVar1);
      if (local_50 == (BYTE *)0x0) {
        local_74 = 2;
      }
      else {
        DVar3 = TRootHandler::GetFlags(*(TRootHandler **)(QueryKey.cbData + 0xd60));
        uVar2 = 1;
        if ((DVar3 & 2) != 0) {
          uVar2 = 2;
        }
        phFile_local._0_4_ = uVar2 | dwOpenFlags;
      }
    }
    else if ((dwOpenFlags & 0xf) - 1 < 2) {
      local_74 = ConvertStringToBinary(szFileName,0x20,local_68);
      if (local_74 == 0) {
        local_50 = local_68;
      }
    }
    else {
      local_74 = 0x16;
    }
    if (local_74 == 0) {
      pbQueryKey = local_50;
      QueryKey.pbData = (LPBYTE)0x10;
      if (((DWORD)phFile_local & 0xf) == 1) {
        local_6d = OpenFileByCKey((TCascStorage *)QueryKey.cbData,(PQUERY_KEY)&pbQueryKey,
                                  (DWORD)phFile_local,(TCascFile **)phFile);
      }
      else if (((DWORD)phFile_local & 0xf) == 2) {
        local_6d = OpenFileByEKey((TCascStorage *)QueryKey.cbData,(PQUERY_KEY)0x0,
                                  (PQUERY_KEY)&pbQueryKey,(DWORD)phFile_local,nError,
                                  (TCascFile **)phFile);
      }
      else {
        SetLastError(0x16);
      }
      if (local_6d == false) {
        DVar3 = GetLastError();
        if (DVar3 == 0) {
          __assert_fail("GetLastError() != ERROR_SUCCESS",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/CascOpenFile.cpp"
                        ,0x112,"bool CascOpenFile(HANDLE, const char *, DWORD, DWORD, HANDLE *)");
        }
        local_74 = GetLastError();
      }
    }
    if (local_74 != 0) {
      SetLastError(local_74);
    }
    hStorage_local._7_1_ = local_74 == 0;
  }
  return hStorage_local._7_1_;
}

Assistant:

bool WINAPI CascOpenFile(HANDLE hStorage, const char * szFileName, DWORD dwLocaleFlags, DWORD dwOpenFlags, HANDLE * phFile)
{
    TCascStorage * hs;
    QUERY_KEY QueryKey;
    LPBYTE pbQueryKey = NULL;
    BYTE KeyBuffer[MD5_HASH_SIZE];
    DWORD dwContentSize = CASC_INVALID_SIZE;
    bool bOpenResult = false;
    int nError = ERROR_SUCCESS;

    // This parameter is not used
    CASCLIB_UNUSED(dwLocaleFlags);

    // Validate the storage handle
    hs = IsValidCascStorageHandle(hStorage);
    if(hs == NULL)
    {
        SetLastError(ERROR_INVALID_HANDLE);
        return false;
    }

    // Validate the other parameters
    if(szFileName == NULL || szFileName[0] == 0 || phFile == NULL)
    {
        SetLastError(ERROR_INVALID_PARAMETER);
        return false;
    }

    // Retrieve the CKey/EKey from the file name in different modes
    switch(dwOpenFlags & CASC_OPEN_TYPE_MASK)
    {
        case CASC_OPEN_BY_NAME:
            
            // Retrieve the file CKey/EKey
            pbQueryKey = hs->pRootHandler->GetKey(szFileName, &dwContentSize);
            if(pbQueryKey == NULL)
            {
                nError = ERROR_FILE_NOT_FOUND;
                break;
            }

            // Change the proper open flags
            dwOpenFlags |= (hs->pRootHandler->GetFlags() & ROOT_FLAG_USES_EKEY) ? CASC_OPEN_BY_EKEY : CASC_OPEN_BY_CKEY;
            break;

        case CASC_OPEN_BY_CKEY:
        case CASC_OPEN_BY_EKEY:

            // Convert the string to binary
            nError = ConvertStringToBinary(szFileName, MD5_STRING_SIZE, KeyBuffer);
            if(nError != ERROR_SUCCESS)
                break;
            
            // Proceed opening by CKey
            pbQueryKey = KeyBuffer;
            break;

        default:

            // Unknown open mode
            nError = ERROR_INVALID_PARAMETER;
            break;
    }

    // Perform the open operation
    if(nError == ERROR_SUCCESS)
    {
        // Setup the CKey/EKey
        QueryKey.pbData = pbQueryKey;
        QueryKey.cbData = MD5_HASH_SIZE;

        // Either open by CKey or EKey
        switch(dwOpenFlags & CASC_OPEN_TYPE_MASK)
        {
            case CASC_OPEN_BY_CKEY:
                bOpenResult = OpenFileByCKey(hs, &QueryKey, dwOpenFlags, (TCascFile **)phFile);
                break;

            case CASC_OPEN_BY_EKEY:
                bOpenResult = OpenFileByEKey(hs, NULL, &QueryKey, dwOpenFlags, dwContentSize, (TCascFile **)phFile);
                break;

            default:
                SetLastError(ERROR_INVALID_PARAMETER);
                break;
        }

        // Handle the error code
        if(!bOpenResult)
        {
            assert(GetLastError() != ERROR_SUCCESS);
            nError = GetLastError();
        }
    }

    // Set the last error and return
    if(nError != ERROR_SUCCESS)
        SetLastError(nError);
    return (nError == ERROR_SUCCESS);
}